

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::IRRMeshImporter::CanRead
          (IRRMeshImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  char *local_68;
  char *tokens [1];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  IRRMeshImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"irrmesh");
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"xml");
    if ((bVar1) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
      if (pIOHandler == (IOSystem *)0x0) {
        this_local._7_1_ = true;
      }
      else {
        local_68 = "irrmesh";
        this_local._7_1_ =
             BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_68,1,200,false,false);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool IRRMeshImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    /* NOTE: A simple check for the file extension is not enough
     * here. Irrmesh and irr are easy, but xml is too generic
     * and could be collada, too. So we need to open the file and
     * search for typical tokens.
     */
    const std::string extension = GetExtension(pFile);

    if (extension == "irrmesh")return true;
    else if (extension == "xml" || checkSig)
    {
        /*  If CanRead() is called to check whether the loader
         *  supports a specific file extension in general we
         *  must return true here.
         */
        if (!pIOHandler)return true;
        const char* tokens[] = {"irrmesh"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}